

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall
xray_re::xr_ogf_v3::set_ext_geom(xr_ogf_v3 *this,xr_vbuf_vec *ext_vbufs,xr_ibuf_vec *ext_ibufs)

{
  pointer pxVar1;
  pointer pxVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (((this->super_xr_ogf).m_loaded & 0x400) != 0) {
    uVar3 = (ulong)this->m_ext_vb_index;
    pxVar1 = (ext_vbufs->super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(ext_vbufs->
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pxVar1 >> 4) * -0x3333333333333333;
    if (uVar4 < uVar3 || uVar4 - uVar3 == 0) goto LAB_0017de90;
    xr_vbuf::proxy(&(this->super_xr_ogf).m_vb,pxVar1 + uVar3,(ulong)this->m_ext_vb_offset,
                   (ulong)this->m_ext_vb_size);
  }
  if (((this->super_xr_ogf).m_loaded & 0x80000) == 0) {
    return;
  }
  uVar3 = (ulong)this->m_ext_ib_index;
  pxVar2 = (ext_ibufs->super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(ext_ibufs->
                            super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>)
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pxVar2 >> 5)) {
    xr_ibuf::proxy(&(this->super_xr_ogf).m_ib,pxVar2 + uVar3,(ulong)this->m_ext_ib_offset,
                   (ulong)this->m_ext_ib_size);
    return;
  }
LAB_0017de90:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
}

Assistant:

void xr_ogf_v3::set_ext_geom(const xr_vbuf_vec& ext_vbufs, const xr_ibuf_vec& ext_ibufs)
{
	if (is_chunk_loaded(OGF3_VCONTAINER))
		m_vb.proxy(ext_vbufs.at(m_ext_vb_index), m_ext_vb_offset, m_ext_vb_size);
	if (is_chunk_loaded(OGF3_ICONTAINER))
		m_ib.proxy(ext_ibufs.at(m_ext_ib_index), m_ext_ib_offset, m_ext_ib_size);
}